

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseRanges(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  bool bVar1;
  bool bVar2;
  Parsekey PVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  iterator iVar7;
  HighsInt HVar8;
  HMpsFF *pHVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  bool skip;
  HighsInt rowidx;
  bool is_nan;
  string word_1;
  size_t end;
  string marker;
  anon_class_8_1_8991fb9c addRhs;
  bool is_nan_1;
  string strline;
  string word;
  size_t begin;
  Parsekey local_150;
  bool local_149;
  HighsLogOptions *local_148;
  ulong local_140;
  ulong local_138;
  int local_12c;
  ulong local_128;
  ulong local_120;
  string local_118;
  HMpsFF *local_f8;
  undefined1 local_f0 [32];
  double local_d0;
  string local_c8;
  vector<bool,_std::allocator<bool>_> *local_a8;
  anon_class_8_1_8991fb9c local_a0;
  string local_98;
  string local_78;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  size_t local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  pHVar9 = (HMpsFF *)&this->has_row_entry_;
  local_148 = log_options;
  local_a8 = (vector<bool,_std::allocator<bool>_> *)pHVar9;
  local_a0.this = this;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar9,(long)this->num_row,false);
  local_f8 = (HMpsFF *)&this->rowname2idx;
  local_128 = 1;
  local_120 = 0;
  local_140 = 1;
  local_138 = 0;
  while( true ) {
    do {
      bVar1 = getMpsLine(pHVar9,file,&local_78,&local_149);
      if (!bVar1) {
        local_150 = kFail;
        goto LAB_001fb275;
      }
    } while (local_149 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar5 = std::chrono::_V2::system_clock::now(),
       dVar11 = (double)lVar5 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar11 && dVar11 != this->time_limit_)) break;
    local_f0._0_8_ = local_f0 + 0x10;
    local_f0._8_8_ = (char *)0x0;
    local_f0[0x10] = '\0';
    PVar3 = checkFirstWord(this,&local_78,&local_38,(size_t *)&local_d0,(string *)local_f0);
    dVar11 = local_d0;
    if (PVar3 == kNone) {
      first_word(&local_c8,&local_78,(size_t)local_d0);
      sVar6 = first_word_end(&local_78,(size_t)dVar11);
      HVar8 = 0x3d2f67;
      std::__cxx11::string::_M_replace((ulong)local_f0,0,(char *)local_f0._8_8_,0x3d2f67);
      first_word(&local_118,&local_78,sVar6);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p) !=
          &local_118.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p))
        ;
      }
      dVar11 = (double)first_word_end(&local_78,sVar6);
      local_d0 = dVar11;
      iVar4 = std::__cxx11::string::compare(local_f0);
      if (iVar4 == 0) {
        trim(&local_c8,&default_non_chars_abi_cxx11_);
        local_150 = kFail;
        bVar1 = false;
        highsLogUser(local_148,kError,"No range given for row \"%s\"\n",local_c8._M_dataplus._M_p);
      }
      else {
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_f8,&local_c8);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_138 = local_138 + 1;
          if (local_138 % local_140 == 0) {
            highsLogUser(local_148,kWarning,
                         "Row name \"%s\" in RANGES section is not defined: ignored\n",
                         local_c8._M_dataplus._M_p);
LAB_001faebf:
            local_140 = local_140 * 2;
          }
        }
        else {
          pHVar9 = local_f8;
          iVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_f8,&local_c8);
          local_12c = *(int *)((long)iVar7.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                     ._M_cur + 0x28);
          uVar10 = (ulong)local_12c;
          if ((long)uVar10 < 0) {
            local_138 = local_138 + 1;
            if (local_138 % local_140 == 0) {
              highsLogUser(local_148,kWarning,
                           "Row name \"%s\" in RANGES section is not valid: ignored\n",
                           local_c8._M_dataplus._M_p);
              goto LAB_001faebf;
            }
          }
          else {
            local_118._M_dataplus._M_p._0_1_ = '\0';
            dVar12 = getValue(pHVar9,(string *)local_f0,(bool *)&local_118,HVar8);
            if ((*(ulong *)(*(long *)&(local_a8->super__Bvector_base<std::allocator<bool>_>)._M_impl
                                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base +
                           (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) == 0) {
              if ((char)local_118._M_dataplus._M_p == '\x01') {
                local_150 = kFail;
                bVar1 = false;
                highsLogUser(local_148,kError,"Range for row \"%s\" is NaN\n",
                             local_c8._M_dataplus._M_p);
              }
              else {
                bVar1 = true;
                parseRanges::anon_class_8_1_8991fb9c::operator()(&local_a0,dVar12,&local_12c);
              }
            }
            else {
              local_120 = local_120 + 1;
              bVar1 = true;
              if (local_120 % local_128 == 0) {
                highsLogUser(local_148,kWarning,
                             "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n",
                             local_c8._M_dataplus._M_p);
                local_128 = local_128 * 2;
              }
            }
            if (!bVar1) {
              bVar1 = false;
              goto LAB_001fb224;
            }
          }
        }
        bVar2 = is_end(&local_78,(size_t)dVar11,&default_non_chars_abi_cxx11_);
        bVar1 = true;
        if (!bVar2) {
          first_word(&local_118,&local_78,(size_t)dVar11);
          sVar6 = first_word_end(&local_78,(size_t)dVar11);
          HVar8 = 0x3d2f67;
          std::__cxx11::string::_M_replace((ulong)local_f0,0,(char *)local_f0._8_8_,0x3d2f67);
          first_word(&local_98,&local_78,sVar6);
          std::__cxx11::string::operator=((string *)local_f0,(string *)&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
              &local_98.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p
                                    ));
          }
          dVar11 = (double)first_word_end(&local_78,sVar6);
          local_d0 = dVar11;
          iVar4 = std::__cxx11::string::compare(local_f0);
          if (iVar4 == 0) {
            trim(&local_118,&default_non_chars_abi_cxx11_);
            local_150 = kFail;
            bVar1 = false;
            highsLogUser(local_148,kError,"No range given for row \"%s\"\n",
                         CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p)
                        );
          }
          else {
            iVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_f8,&local_118);
            if (iVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_138 = local_138 + 1;
              if (local_138 % local_140 == 0) {
                highsLogUser(local_148,kWarning,
                             "Row name \"%s\" in RANGES section is not defined: ignored\n",
                             CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                      (char)local_118._M_dataplus._M_p));
LAB_001fb15c:
                local_140 = local_140 * 2;
              }
            }
            else {
              pHVar9 = local_f8;
              iVar7 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_f8,&local_118);
              local_12c = *(int *)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                         ._M_cur + 0x28);
              uVar10 = (ulong)local_12c;
              if ((long)uVar10 < 0) {
                local_138 = local_138 + 1;
                if (local_138 % local_140 == 0) {
                  highsLogUser(local_148,kWarning,
                               "Row name \"%s\" in RANGES section is not valid: ignored\n",
                               CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                        (char)local_118._M_dataplus._M_p));
                  goto LAB_001fb15c;
                }
              }
              else {
                local_98._M_dataplus._M_p._0_1_ = '\0';
                dVar12 = getValue(pHVar9,(string *)local_f0,(bool *)&local_98,HVar8);
                if ((*(ulong *)(*(long *)&(local_a8->super__Bvector_base<std::allocator<bool>_>).
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base + (uVar10 >> 6) * 8) >>
                     (uVar10 & 0x3f) & 1) == 0) {
                  if ((char)local_98._M_dataplus._M_p == '\x01') {
                    local_150 = kFail;
                    bVar1 = false;
                    highsLogUser(local_148,kError,"Range for row \"%s\" is NaN\n",
                                 CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                          (char)local_118._M_dataplus._M_p));
                  }
                  else {
                    bVar1 = true;
                    parseRanges::anon_class_8_1_8991fb9c::operator()(&local_a0,dVar12,&local_12c);
                  }
                }
                else {
                  local_120 = local_120 + 1;
                  bVar1 = true;
                  if (local_120 % local_128 == 0) {
                    highsLogUser(local_148,kWarning,
                                 "Row name \"%s\" in RANGES section has duplicate value %g: ignored\n"
                                 ,CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                           (char)local_118._M_dataplus._M_p));
                    local_128 = local_128 * 2;
                  }
                }
                if (!bVar1) {
                  bVar1 = false;
                  goto LAB_001fb210;
                }
              }
            }
            bVar2 = is_end(&local_78,(size_t)dVar11,&default_non_chars_abi_cxx11_);
            bVar1 = true;
            if (!bVar2) {
              trim(&local_118,&default_non_chars_abi_cxx11_);
              local_150 = kFail;
              bVar1 = false;
              highsLogUser(local_148,kError,"Unknown specifiers in RANGES section for row \"%s\"\n",
                           CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                    (char)local_118._M_dataplus._M_p));
            }
          }
LAB_001fb210:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_118._M_dataplus._M_p._1_7_,(char)local_118._M_dataplus._M_p) !=
              &local_118.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_118._M_dataplus._M_p._1_7_,
                                     (char)local_118._M_dataplus._M_p));
          }
        }
      }
LAB_001fb224:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
    }
    else {
      this->warning_issued_ = local_138 != 0 || local_120 != 0;
      if (local_138 != 0 || local_120 != 0) {
        highsLogUser(local_148,kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d duplicate values\n",
                     local_138,local_120);
      }
      bVar1 = false;
      highsLogDev(local_148,kInfo,"readMPS: Read RANGES  OK\n");
      local_150 = PVar3;
    }
    pHVar9 = (HMpsFF *)local_f0._0_8_;
    if ((HMpsFF *)local_f0._0_8_ != (HMpsFF *)(local_f0 + 0x10)) {
      operator_delete((void *)local_f0._0_8_);
    }
    if (!bVar1) {
LAB_001fb275:
      if (local_58 != local_48) {
        operator_delete(local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      return local_150;
    }
  }
  local_150 = kTimeout;
  goto LAB_001fb275;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRanges(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  auto parseName = [this](const std::string& name, HighsInt& rowidx) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);
  };

  auto addRhs = [this](double val, HighsInt& rowidx) {
    if ((row_type[rowidx] == Boundtype::kEq && val < 0) ||
        row_type[rowidx] == Boundtype::kLe) {
      assert(row_upper.at(rowidx) < kHighsInf);
      row_lower.at(rowidx) = row_upper.at(rowidx) - fabs(val);
    } else if ((row_type[rowidx] == Boundtype::kEq && val > 0) ||
               row_type[rowidx] == Boundtype::kGe) {
      assert(row_lower.at(rowidx) > (-kHighsInf));
      row_upper.at(rowidx) = row_lower.at(rowidx) + fabs(val);
    }
    has_row_entry_[rowidx] = true;
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_range = 0;
  size_t report_ignored_duplicate_range_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin, end;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    if (key != Parsekey::kNone) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_range > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "RANGES section: ignored %d undefined/illegal rows and %d "
                     "duplicate values\n",
                     int(num_ignored_row_name),
                     int(num_ignored_duplicate_range));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RANGES  OK\n");
      return key;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No range given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);
    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Row name \"%s\" in RANGES section is not defined: ignored\n",
            marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      parseName(marker, rowidx);
      if (rowidx < 0) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not valid: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        bool is_nan = false;
        double value = getValue(word, is_nan);  // atof(word.c_str());
        if (has_row_entry_[rowidx]) {
          num_ignored_duplicate_range++;
          if (num_ignored_duplicate_range %
                  report_ignored_duplicate_range_frequency ==
              0) {
            highsLogUser(log_options, HighsLogType::kWarning,
                         "Row name \"%s\" in RANGES section has duplicate "
                         "value %g: ignored\n",
                         marker.c_str(), value);
            report_ignored_duplicate_range_frequency *= 2;
          }
        } else {
          if (is_nan) {
            highsLogUser(log_options, HighsLogType::kError,
                         "Range for row \"%s\" is NaN\n", marker.c_str());
            return HMpsFF::Parsekey::kFail;
          }
          addRhs(value, rowidx);
        }
      }
    }

    if (!is_end(strline, end)) {
      std::string marker = first_word(strline, end);
      size_t end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No range given for row \"%s\"\n", marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RANGES section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
      } else {
        parseName(marker, rowidx);
        if (rowidx < 0) {
          num_ignored_row_name++;
          if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
            highsLogUser(
                log_options, HighsLogType::kWarning,
                "Row name \"%s\" in RANGES section is not valid: ignored\n",
                marker.c_str());
            report_ignored_row_name_frequency *= 2;
          }
        } else {
          bool is_nan = false;
          double value = getValue(word, is_nan);  // atof(word.c_str());
          if (has_row_entry_[rowidx]) {
            num_ignored_duplicate_range++;
            if (num_ignored_duplicate_range %
                    report_ignored_duplicate_range_frequency ==
                0) {
              highsLogUser(log_options, HighsLogType::kWarning,
                           "Row name \"%s\" in RANGES section has duplicate "
                           "value %g: ignored\n",
                           marker.c_str(), value);
              report_ignored_duplicate_range_frequency *= 2;
            }
          } else {
            if (is_nan) {
              highsLogUser(log_options, HighsLogType::kError,
                           "Range for row \"%s\" is NaN\n", marker.c_str());
              return HMpsFF::Parsekey::kFail;
            }
            addRhs(value, rowidx);
          }
        }
      }

      if (!is_end(strline, end)) {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "Unknown specifiers in RANGES section for row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
    }
  }

  return HMpsFF::Parsekey::kFail;
}